

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.h
# Opt level: O2

void __thiscall lazyTrees::LazyKdTree<Point2D>::ensure_evaluated_fully(LazyKdTree<Point2D> *this)

{
  LazyKdTree<Point2D> *this_00;
  
  do {
    ensure_evaluated(this);
    this_00 = (this->childNegative)._M_t.
              super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
              .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    if (this_00 != (LazyKdTree<Point2D> *)0x0) {
      ensure_evaluated_fully(this_00);
    }
    this = (this->childPositive)._M_t.
           super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
  } while (this != (LazyKdTree<Point2D> *)0x0);
  return;
}

Assistant:

void ensure_evaluated_fully()
    {
        ensure_evaluated();
        if (childNegative)
            childNegative->ensure_evaluated_fully();
        if (childPositive)
            childPositive->ensure_evaluated_fully();
    }